

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdockwidget.cpp
# Opt level: O1

void QDockWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  DockWidgetArea *pDVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  QString *title;
  DockWidgetArea DVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined4 local_5c;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_5c = *_a[1];
      iVar7 = 0;
      break;
    case 1:
      local_5c = CONCAT31(local_5c._1_3_,*_a[1]);
      iVar7 = 1;
      break;
    case 2:
      local_5c = *_a[1];
      iVar7 = 2;
      break;
    case 3:
      local_5c = CONCAT31(local_5c._1_3_,*_a[1]);
      iVar7 = 3;
      break;
    case 4:
      local_5c = *_a[1];
      iVar7 = 4;
      break;
    default:
      goto switchD_0040a4ee_default;
    }
    local_58.d.ptr = (char16_t *)&local_5c;
    local_58.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,(void **)&local_58);
switchD_0040a4ee_default:
    if (_c == ReadProperty) goto switchD_0040a4d2_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0040a4d2_caseD_3;
      goto switchD_0040a4d2_caseD_5;
    }
    break;
  case ReadProperty:
switchD_0040a4d2_caseD_1:
    if (4 < (uint)_id) goto LAB_0040a7a3;
    pDVar2 = (DockWidgetArea *)*_a;
    switch(_id) {
    case 0:
      *(undefined1 *)pDVar2 = *(byte *)(*(long *)(_o + 0x20) + 0xc) & LeftDockWidgetArea;
      goto LAB_0040a7a3;
    case 1:
      DVar6 = *(DockWidgetArea *)(*(long *)(_o + 8) + 0x260);
      break;
    case 2:
      DVar6 = *(DockWidgetArea *)(*(long *)(_o + 8) + 0x264);
      break;
    case 3:
      QWidget::windowTitle(&local_58,(QWidget *)_o);
      pQVar3 = *(QArrayData **)pDVar2;
      *(Data **)pDVar2 = local_58.d.d;
      pcVar4 = *(char16_t **)(pDVar2 + 2);
      *(char16_t **)(pDVar2 + 2) = local_58.d.ptr;
      uVar5 = *(undefined8 *)(pDVar2 + 4);
      *(qsizetype *)(pDVar2 + 4) = local_58.d.size;
      local_58.d.d = (Data *)pQVar3;
      local_58.d.ptr = pcVar4;
      local_58.d.size = uVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      goto LAB_0040a7a3;
    case 4:
      DVar6 = dockLocation((QDockWidget *)_o);
    }
    *pDVar2 = DVar6;
LAB_0040a7a3:
    if (_c != WriteProperty) goto switchD_0040a4d2_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0040a4d2_caseD_3;
  case IndexOfMethod:
switchD_0040a4d2_caseD_5:
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == featuresChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0040a4d2_caseD_3;
    }
    if (((code *)*plVar1 == topLevelChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_0040a4d2_caseD_3;
    }
    if (((code *)*plVar1 == allowedAreasChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_0040a4d2_caseD_3;
    }
    if (((code *)*plVar1 == visibilityChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_0040a4d2_caseD_3;
    }
    if (((code *)*plVar1 == dockLocationChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 4;
      goto switchD_0040a4d2_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0040a4d2_caseD_3;
      goto switchD_0040a4d2_caseD_1;
    }
  }
  if ((uint)_id < 5) {
    title = (QString *)*_a;
    switch(_id) {
    case 0:
      QDockWidgetPrivate::setFloating(*(QDockWidgetPrivate **)(_o + 8),*(bool *)&(title->d).d);
      break;
    case 1:
      setFeatures((QDockWidget *)_o,
                  (QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>)
                  *(QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> *)&(title->d).d);
      break;
    case 2:
      setAllowedAreas((QDockWidget *)_o,
                      (QFlagsStorageHelper<Qt::DockWidgetArea,_4>)
                      *(QFlagsStorageHelper<Qt::DockWidgetArea,_4> *)&(title->d).d);
      break;
    case 3:
      QWidget::setWindowTitle((QWidget *)_o,title);
      break;
    case 4:
      setDockLocation((QDockWidget *)_o,*(DockWidgetArea *)&(title->d).d);
    }
  }
switchD_0040a4d2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDockWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->featuresChanged((*reinterpret_cast< std::add_pointer_t<QDockWidget::DockWidgetFeatures>>(_a[1]))); break;
        case 1: _t->topLevelChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->allowedAreasChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetAreas>>(_a[1]))); break;
        case 3: _t->visibilityChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->dockLocationChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetArea>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(QDockWidget::DockWidgetFeatures )>(_a, &QDockWidget::featuresChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::topLevelChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetAreas )>(_a, &QDockWidget::allowedAreasChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::visibilityChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetArea )>(_a, &QDockWidget::dockLocationChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isFloating(); break;
        case 1: QtMocHelpers::assignFlags<DockWidgetFeatures>(_v, _t->features()); break;
        case 2: *reinterpret_cast<Qt::DockWidgetAreas*>(_v) = _t->allowedAreas(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 4: *reinterpret_cast<Qt::DockWidgetArea*>(_v) = _t->dockLocation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFloating(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFeatures(*reinterpret_cast<DockWidgetFeatures*>(_v)); break;
        case 2: _t->setAllowedAreas(*reinterpret_cast<Qt::DockWidgetAreas*>(_v)); break;
        case 3: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setDockLocation(*reinterpret_cast<Qt::DockWidgetArea*>(_v)); break;
        default: break;
        }
    }
}